

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O0

void __thiscall
MGARD::Recomposer<float>::recompose_level_1D
          (Recomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  float *nodal_buffer_00;
  ostream *this_00;
  float *coeff_buffer_00;
  byte in_CL;
  size_t n_nodal_00;
  size_t n_coeff_00;
  ulong in_RDX;
  float *in_RSI;
  Recomposer<float> *in_RDI;
  float in_XMM0_Da;
  float *coeff_buffer;
  float *nodal_buffer;
  size_t n_coeff;
  size_t n_nodal;
  undefined3 in_stack_00000028;
  
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,in_RDX);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  n_nodal_00 = (in_RDX >> 1) + 1;
  n_coeff_00 = in_RDX - n_nodal_00;
  memcpy(in_RDI->data_buffer,in_RSI,in_RDX << 2);
  nodal_buffer_00 = in_RDI->data_buffer;
  coeff_buffer_00 = in_RDI->data_buffer + n_nodal_00;
  if ((in_CL & 1) == 0) {
    compute_load_vector_coeff_row<float>
              (in_RDI->load_v_buffer,n_nodal_00,n_coeff_00,in_XMM0_Da,nodal_buffer_00,
               coeff_buffer_00);
  }
  else {
    compute_load_vector_nodal_row<float>
              (in_RDI->load_v_buffer,n_nodal_00,n_coeff_00,in_XMM0_Da,coeff_buffer_00);
  }
  compute_correction<float>
            ((float *)this,(size_t)data_pos,n._4_4_,(float *)CONCAT44(h,_in_stack_00000028));
  subtract_correction(in_RDI,n_nodal_00,nodal_buffer_00);
  recover_from_interpolant_difference_1D(in_RDI,n_coeff_00,nodal_buffer_00,coeff_buffer_00);
  data_reverse_reorder_1D<float>
            (in_RSI,(int)n_nodal_00,(int)n_coeff_00,nodal_buffer_00,coeff_buffer_00);
  return;
}

Assistant:

void recompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		cerr << n << endl;
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		memcpy(data_buffer, data_pos, n*sizeof(T));
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		subtract_correction(n_nodal, nodal_buffer);
		recover_from_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		data_reverse_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
	}